

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void sleep_ms(int milliseconds)

{
  undefined1 local_20 [8];
  timespec ts;
  int milliseconds_local;
  
  local_20 = (undefined1  [8])(long)(milliseconds / 1000);
  ts.tv_sec = (__time_t)((milliseconds % 1000) * 1000000);
  ts.tv_nsec._4_4_ = milliseconds;
  nanosleep((timespec *)local_20,(timespec *)0x0);
  return;
}

Assistant:

void sleep_ms(int milliseconds) // cross-platform sleep function
{
#ifdef WIN32
    Sleep(milliseconds);
#elif _POSIX_C_SOURCE >= 199309L
    struct timespec ts;
    ts.tv_sec = milliseconds / 1000;
    ts.tv_nsec = (milliseconds % 1000) * 1000000;
    nanosleep(&ts, NULL);
#endif
}